

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

Prog * re2::Compiler::CompileSet(Regexp *re,Anchor anchor,int64_t max_mem)

{
  Frag a;
  Frag b;
  Frag this;
  int in_ESI;
  Regexp *in_RDI;
  StringPiece sp;
  bool dfa_failed;
  Prog *prog;
  Frag all;
  Regexp *sre;
  Compiler c;
  Compiler *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  Anchor in_stack_fffffffffffffe9c;
  Walker<re2::Frag> *in_stack_fffffffffffffea0;
  Frag in_stack_fffffffffffffea8;
  Compiler *in_stack_fffffffffffffeb0;
  Compiler *in_stack_fffffffffffffec0;
  Regexp *in_stack_fffffffffffffee0;
  Regexp *in_stack_fffffffffffffef8;
  Frag local_e4;
  Frag local_dc;
  undefined4 local_d4;
  Frag local_d0;
  StringPiece *in_stack_ffffffffffffff48;
  MatchKind in_stack_ffffffffffffff50;
  Anchor in_stack_ffffffffffffff54;
  StringPiece *in_stack_ffffffffffffff58;
  Prog *in_stack_ffffffffffffff60;
  byte in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff69;
  bool *in_stack_ffffffffffffff80;
  SparseSet *in_stack_ffffffffffffff88;
  Prog *local_8;
  
  Compiler(in_stack_fffffffffffffec0);
  Regexp::parse_flags(in_RDI);
  Setup(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8.end.p.p,
        (int64_t)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
  a = (Frag)Regexp::Simplify(in_stack_fffffffffffffef8);
  local_d0 = a;
  if (a == (Frag)0x0) {
    local_8 = (Prog *)0x0;
  }
  else {
    Frag::Frag(&local_e4);
    b = Regexp::Walker<re2::Frag>::WalkExponential
                  (in_stack_fffffffffffffea0,
                   (Regexp *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                   in_stack_fffffffffffffea8,(int)((ulong)in_stack_fffffffffffffe90 >> 0x20));
    local_dc = b;
    Regexp::Decref(in_stack_fffffffffffffee0);
    if ((in_stack_ffffffffffffff68 & 1) == 0) {
      Prog::set_anchor_start(in_stack_ffffffffffffff60,true);
      Prog::set_anchor_end(in_stack_ffffffffffffff60,true);
      if (in_ESI == 0) {
        this = DotStar((Compiler *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        local_dc = Cat((Compiler *)this,a,b);
      }
      Prog::set_start(in_stack_ffffffffffffff60,local_dc.begin);
      Prog::set_start_unanchored(in_stack_ffffffffffffff60,local_dc.begin);
      local_8 = Finish((Compiler *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      if (local_8 == (Prog *)0x0) {
        local_8 = (Prog *)0x0;
      }
      else {
        StringPiece::StringPiece
                  ((StringPiece *)in_stack_fffffffffffffea0,
                   (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        in_stack_fffffffffffffe90 = (Compiler *)0x0;
        Prog::SearchDFA((Prog *)CONCAT71(in_stack_ffffffffffffff69,in_stack_ffffffffffffff68),
                        (StringPiece *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                        in_stack_ffffffffffffff54,in_stack_ffffffffffffff50,
                        in_stack_ffffffffffffff48,in_stack_ffffffffffffff80,
                        in_stack_ffffffffffffff88);
      }
    }
    else {
      local_8 = (Prog *)0x0;
    }
  }
  local_d4 = 1;
  ~Compiler(in_stack_fffffffffffffe90);
  return local_8;
}

Assistant:

Prog* Compiler::CompileSet(Regexp* re, RE2::Anchor anchor, int64_t max_mem) {
  Compiler c;
  c.Setup(re->parse_flags(), max_mem, anchor);

  Regexp* sre = re->Simplify();
  if (sre == NULL)
    return NULL;

  Frag all = c.WalkExponential(sre, Frag(), 2*c.max_ninst_);
  sre->Decref();
  if (c.failed_)
    return NULL;

  c.prog_->set_anchor_start(true);
  c.prog_->set_anchor_end(true);

  if (anchor == RE2::UNANCHORED) {
    // Prepend .* or else the expression will effectively be anchored.
    // Complemented by the ANCHOR_BOTH case in PostVisit().
    all = c.Cat(c.DotStar(), all);
  }
  c.prog_->set_start(all.begin);
  c.prog_->set_start_unanchored(all.begin);

  Prog* prog = c.Finish();
  if (prog == NULL)
    return NULL;

  // Make sure DFA has enough memory to operate,
  // since we're not going to fall back to the NFA.
  bool dfa_failed = false;
  StringPiece sp = "hello, world";
  prog->SearchDFA(sp, sp, Prog::kAnchored, Prog::kManyMatch,
                  NULL, &dfa_failed, NULL);
  if (dfa_failed) {
    delete prog;
    return NULL;
  }

  return prog;
}